

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.h
# Opt level: O3

string_view __thiscall absl::StripAsciiWhitespace(absl *this,string_view str)

{
  absl *paVar1;
  ulong uVar2;
  long lVar3;
  absl *paVar4;
  absl *paVar5;
  absl *paVar6;
  ulong uVar7;
  string_view sVar8;
  
  paVar4 = (absl *)str._M_len;
  paVar5 = this + (long)paVar4;
  paVar1 = paVar4;
  if (0 < (long)this >> 2) {
    paVar1 = paVar4 + ((ulong)this & 0xfffffffffffffffc);
    lVar3 = ((long)this >> 2) + 1;
    paVar6 = paVar4 + 3;
    do {
      if (((&ascii_internal::kPropertyBits)[(byte)paVar6[-3]] & 8) == 0) {
        paVar6 = paVar6 + -3;
        goto LAB_0025bcfd;
      }
      if (((&ascii_internal::kPropertyBits)[(byte)paVar6[-2]] & 8) == 0) {
        paVar6 = paVar6 + -2;
        goto LAB_0025bcfd;
      }
      if (((&ascii_internal::kPropertyBits)[(byte)paVar6[-1]] & 8) == 0) {
        paVar6 = paVar6 + -1;
        goto LAB_0025bcfd;
      }
      if (((&ascii_internal::kPropertyBits)[(byte)*paVar6] & 8) == 0) goto LAB_0025bcfd;
      lVar3 = lVar3 + -1;
      paVar6 = paVar6 + 4;
    } while (1 < lVar3);
  }
  lVar3 = (long)paVar5 - (long)paVar1;
  if (lVar3 == 1) {
LAB_0025bce6:
    paVar6 = paVar1;
    if (((&ascii_internal::kPropertyBits)[(byte)*paVar1] & 8) != 0) {
      paVar6 = paVar5;
    }
  }
  else if (lVar3 == 2) {
LAB_0025bcbc:
    paVar6 = paVar1;
    if (((&ascii_internal::kPropertyBits)[(byte)*paVar1] & 8) != 0) {
      paVar1 = paVar1 + 1;
      goto LAB_0025bce6;
    }
  }
  else {
    paVar6 = paVar5;
    if ((lVar3 == 3) &&
       (paVar6 = paVar1, ((&ascii_internal::kPropertyBits)[(byte)*paVar1] & 8) != 0)) {
      paVar1 = paVar1 + 1;
      goto LAB_0025bcbc;
    }
  }
LAB_0025bcfd:
  paVar1 = paVar6 + -(long)paVar4;
  uVar7 = (long)this - (long)paVar1;
  if (this < paVar1) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
  }
  paVar4 = paVar4 + (long)paVar1;
  paVar1 = paVar5;
  if (0 < (long)uVar7 >> 2) {
    paVar1 = paVar4 + ((uint)uVar7 & 3);
    lVar3 = ((long)uVar7 >> 2) + 1;
    do {
      if (((&ascii_internal::kPropertyBits)[(byte)paVar5[-1]] & 8) == 0) goto LAB_0025bde5;
      if (((&ascii_internal::kPropertyBits)[(byte)paVar5[-2]] & 8) == 0) {
        paVar5 = paVar5 + -1;
        goto LAB_0025bde5;
      }
      if (((&ascii_internal::kPropertyBits)[(byte)paVar5[-3]] & 8) == 0) {
        paVar5 = paVar5 + -2;
        goto LAB_0025bde5;
      }
      if (((&ascii_internal::kPropertyBits)[(byte)paVar5[-4]] & 8) == 0) {
        paVar5 = paVar5 + -3;
        goto LAB_0025bde5;
      }
      paVar5 = paVar5 + -4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)paVar1 - (long)paVar6;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      paVar5 = paVar4;
      if ((lVar3 != 3) ||
         (paVar5 = paVar1, ((&ascii_internal::kPropertyBits)[(byte)paVar1[-1]] & 8) == 0))
      goto LAB_0025bde5;
      paVar1 = paVar1 + -1;
    }
    paVar5 = paVar1;
    if (((&ascii_internal::kPropertyBits)[(byte)paVar1[-1]] & 8) == 0) goto LAB_0025bde5;
    paVar1 = paVar1 + -1;
  }
  paVar5 = paVar1;
  if (((&ascii_internal::kPropertyBits)[(byte)paVar1[-1]] & 8) != 0) {
    paVar5 = paVar4;
  }
LAB_0025bde5:
  uVar2 = (long)paVar5 - (long)paVar6;
  if (uVar7 < (ulong)((long)paVar5 - (long)paVar6)) {
    uVar2 = uVar7;
  }
  sVar8._M_str = (char *)paVar4;
  sVar8._M_len = uVar2;
  return sVar8;
}

Assistant:

ABSL_MUST_USE_RESULT inline absl::string_view StripAsciiWhitespace(
    absl::string_view str) {
  return StripTrailingAsciiWhitespace(StripLeadingAsciiWhitespace(str));
}